

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::VerilogModule::verilog_src_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,VerilogModule *this,SystemVerilogCodeGenOptions *options)

{
  Generator *this_00;
  SystemVerilogCodeGenOptions *options_00;
  SystemVerilogCodeGenOptions *local_20;
  SystemVerilogCodeGenOptions *options_local;
  VerilogModule *this_local;
  
  this_00 = this->generator_;
  options_00 = (SystemVerilogCodeGenOptions *)__return_storage_ptr__;
  local_20 = options;
  options_local = (SystemVerilogCodeGenOptions *)this;
  this_local = (VerilogModule *)__return_storage_ptr__;
  SystemVerilogCodeGenOptions::SystemVerilogCodeGenOptions
            ((SystemVerilogCodeGenOptions *)&stack0xffffffffffffff88,options);
  generate_verilog_abi_cxx11_
            (__return_storage_ptr__,(kratos *)this_00,(Generator *)&stack0xffffffffffffff88,
             options_00);
  SystemVerilogCodeGenOptions::~SystemVerilogCodeGenOptions
            ((SystemVerilogCodeGenOptions *)&stack0xffffffffffffff88);
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::string> VerilogModule::verilog_src(SystemVerilogCodeGenOptions options) {
    return generate_verilog(generator_, options);
}